

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_subscription_free(subscription_s *s)

{
  uintptr_t *puVar1;
  uintptr_t uVar2;
  subscription_s *s_local;
  
  LOCK();
  puVar1 = &s->ref;
  uVar2 = *puVar1;
  *puVar1 = *puVar1 - 1;
  UNLOCK();
  if (uVar2 == 1) {
    if (s->on_unsubscribe != (_func_void_void_ptr_void_ptr *)0x0) {
      (*s->on_unsubscribe)(s->udata1,s->udata2);
    }
    fio_channel_free(s->parent);
    fio_free(s);
  }
  return;
}

Assistant:

static inline void fio_subscription_free(subscription_s *s) {
  if (fio_atomic_sub(&s->ref, 1)) {
    return;
  }
  if (s->on_unsubscribe) {
    s->on_unsubscribe(s->udata1, s->udata2);
  }
  fio_channel_free(s->parent);
  fio_free(s);
}